

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry_bp.c
# Opt level: O0

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  double *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  UserData data;
  int iright;
  int ileft;
  int iup;
  int idn;
  int jy;
  int jx;
  sunrealtype *dudata;
  sunrealtype *udata;
  sunrealtype horaco;
  sunrealtype hordco;
  sunrealtype verdco;
  sunrealtype dely;
  sunrealtype q4coef;
  sunrealtype yup;
  sunrealtype ydn;
  sunrealtype vertd2;
  sunrealtype vertd1;
  sunrealtype s;
  sunrealtype rkin2;
  sunrealtype rkin1;
  sunrealtype qq4;
  sunrealtype qq3;
  sunrealtype qq2;
  sunrealtype qq1;
  sunrealtype horad2;
  sunrealtype horad1;
  sunrealtype hord2;
  sunrealtype hord1;
  sunrealtype cyup;
  sunrealtype cydn;
  sunrealtype c2rt;
  sunrealtype c1rt;
  sunrealtype c2lt;
  sunrealtype c1lt;
  sunrealtype c2up;
  sunrealtype c1up;
  sunrealtype c2dn;
  sunrealtype c1dn;
  sunrealtype c2;
  sunrealtype c1;
  sunrealtype q3;
  int local_140;
  int local_13c;
  double local_28;
  
  lVar22 = N_VGetArrayPointer(in_RDI);
  lVar23 = N_VGetArrayPointer(in_RSI);
  dVar13 = sin(in_RDX[1] * (double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  if (dVar13 <= 0.0) {
    local_28 = 0.0;
    *in_RDX = 0.0;
  }
  else {
    local_28 = exp(-22.62 / dVar13);
    dVar13 = exp(-7.601 / dVar13);
    *in_RDX = dVar13;
  }
  dVar13 = *in_RDX;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[6];
  dVar3 = in_RDX[4];
  dVar4 = in_RDX[5];
  for (local_140 = 0; local_140 < 10; local_140 = local_140 + 1) {
    dVar14 = ((double)local_140 - 0.5) * dVar1 + 30.0;
    dVar15 = exp(dVar14 * 0.2);
    dVar15 = dVar2 * dVar15;
    dVar14 = exp((dVar14 + dVar1) * 0.2);
    dVar14 = dVar2 * dVar14;
    iVar18 = -1;
    if (local_140 == 0) {
      iVar18 = 1;
    }
    iVar19 = 1;
    if (local_140 == 9) {
      iVar19 = -1;
    }
    for (local_13c = 0; local_13c < 10; local_13c = local_13c + 1) {
      dVar5 = *(double *)(lVar22 + (long)(local_13c * 2 + local_140 * 0x14) * 8);
      dVar6 = *(double *)(lVar22 + (long)(local_13c * 2 + 1 + local_140 * 0x14) * 8);
      dVar16 = dVar5 * 1.63e-16 * 3.7e+16;
      dVar17 = dVar5 * 4.66e-16 * dVar6;
      dVar7 = *(double *)(lVar22 + (long)(local_13c * 2 + 1 + (local_140 + iVar18) * 0x14) * 8);
      dVar8 = *(double *)(lVar22 + (long)(local_13c * 2 + 1 + (local_140 + iVar19) * 0x14) * 8);
      iVar20 = -1;
      if (local_13c == 0) {
        iVar20 = 1;
      }
      iVar21 = 1;
      if (local_13c == 9) {
        iVar21 = -1;
      }
      dVar9 = *(double *)(lVar22 + (long)((local_13c + iVar20) * 2 + local_140 * 0x14) * 8);
      dVar10 = *(double *)(lVar22 + (long)((local_13c + iVar20) * 2 + 1 + local_140 * 0x14) * 8);
      dVar11 = *(double *)(lVar22 + (long)((local_13c + iVar21) * 2 + local_140 * 0x14) * 8);
      dVar12 = *(double *)(lVar22 + (long)((local_13c + iVar21) * 2 + 1 + local_140 * 0x14) * 8);
      *(double *)(lVar23 + (long)(local_13c * 2 + local_140 * 0x14) * 8) =
           dVar14 * (*(double *)(lVar22 + (long)(local_13c * 2 + (local_140 + iVar19) * 0x14) * 8) -
                    dVar5) +
           -(dVar15 * (dVar5 - *(double *)
                                (lVar22 + (long)(local_13c * 2 + (local_140 + iVar18) * 0x14) * 8)))
           + dVar3 * ((dVar11 - (dVar5 + dVar5)) + dVar9) + dVar4 * (dVar11 - dVar9) +
           local_28 * 3.7e+16 + local_28 * 3.7e+16 + (-dVar16 - dVar17) + dVar13 * dVar6;
      *(double *)(lVar23 + (long)(local_13c * 2 + 1 + local_140 * 0x14) * 8) =
           dVar14 * (dVar8 - dVar6) + -(dVar15 * (dVar6 - dVar7)) +
           dVar3 * ((dVar12 - (dVar6 + dVar6)) + dVar10) + dVar4 * (dVar12 - dVar10) +
           ((dVar16 - dVar17) - dVar13 * dVar6);
    }
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype q3, c1, c2, c1dn, c2dn, c1up, c2up, c1lt, c2lt;
  sunrealtype c1rt, c2rt, cydn, cyup, hord1, hord2, horad1, horad2;
  sunrealtype qq1, qq2, qq3, qq4, rkin1, rkin2, s, vertd1, vertd2, ydn, yup;
  sunrealtype q4coef, dely, verdco, hordco, horaco;
  sunrealtype *udata, *dudata;
  int jx, jy, idn, iup, ileft, iright;
  UserData data;

  data   = (UserData)user_data;
  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO)
  {
    q3       = exp(-A3 / s);
    data->q4 = exp(-A4 / s);
  }
  else
  {
    q3       = ZERO;
    data->q4 = ZERO;
  }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  dely   = data->dy;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jy = 0; jy < MY; jy++)
  {
    /* Set vertical diffusion coefficients at jy +- 1/2 */

    ydn  = YMIN + (jy - SUN_RCONST(0.5)) * dely;
    yup  = ydn + dely;
    cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
    cyup = verdco * exp(SUN_RCONST(0.2) * yup);
    idn  = (jy == 0) ? 1 : -1;
    iup  = (jy == MY - 1) ? -1 : 1;
    for (jx = 0; jx < MX; jx++)
    {
      /* Extract c1 and c2, and set kinetic rate terms. */

      c1    = IJKth(udata, 1, jx, jy);
      c2    = IJKth(udata, 2, jx, jy);
      qq1   = Q1 * c1 * C3;
      qq2   = Q2 * c1 * c2;
      qq3   = q3 * C3;
      qq4   = q4coef * c2;
      rkin1 = -qq1 - qq2 + TWO * qq3 + qq4;
      rkin2 = qq1 - qq2 - qq4;

      /* Set vertical diffusion terms. */

      c1dn   = IJKth(udata, 1, jx, jy + idn);
      c2dn   = IJKth(udata, 2, jx, jy + idn);
      c1up   = IJKth(udata, 1, jx, jy + iup);
      c2up   = IJKth(udata, 2, jx, jy + iup);
      vertd1 = cyup * (c1up - c1) - cydn * (c1 - c1dn);
      vertd2 = cyup * (c2up - c2) - cydn * (c2 - c2dn);

      /* Set horizontal diffusion and advection terms. */

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;
      c1lt   = IJKth(udata, 1, jx + ileft, jy);
      c2lt   = IJKth(udata, 2, jx + ileft, jy);
      c1rt   = IJKth(udata, 1, jx + iright, jy);
      c2rt   = IJKth(udata, 2, jx + iright, jy);
      hord1  = hordco * (c1rt - TWO * c1 + c1lt);
      hord2  = hordco * (c2rt - TWO * c2 + c2lt);
      horad1 = horaco * (c1rt - c1lt);
      horad2 = horaco * (c2rt - c2lt);

      /* Load all terms into udot. */

      IJKth(dudata, 1, jx, jy) = vertd1 + hord1 + horad1 + rkin1;
      IJKth(dudata, 2, jx, jy) = vertd2 + hord2 + horad2 + rkin2;
    }
  }

  return (0);
}